

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O0

void __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::printTo
          (SamplingStrategyResponse *this,ostream *out)

{
  ostream *poVar1;
  string local_b8;
  byte local_91;
  string local_90;
  byte local_69;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *out_local;
  SamplingStrategyResponse *this_local;
  
  local_18 = out;
  out_local = (ostream *)this;
  std::operator<<(out,"SamplingStrategyResponse(");
  poVar1 = std::operator<<(local_18,"strategyType=");
  apache::thrift::to_string<jaegertracing::sampling_manager::thrift::SamplingStrategyType::type>
            (&local_38,&this->strategyType);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"probabilisticSampling=");
  poVar1 = local_18;
  local_69 = 0;
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::
    to_string<jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy>
              (&local_68,&this->probabilisticSampling);
    local_69 = 1;
    std::operator<<(poVar1,(string *)&local_68);
  }
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"rateLimitingSampling=");
  poVar1 = local_18;
  local_91 = 0;
  if (((byte)this->__isset >> 1 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy>
              (&local_90,&this->rateLimitingSampling);
    local_91 = 1;
    std::operator<<(poVar1,(string *)&local_90);
  }
  if ((local_91 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"operationSampling=");
  poVar1 = local_18;
  if (((byte)this->__isset >> 2 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::
    to_string<jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies>
              (&local_b8,&this->operationSampling);
    std::operator<<(poVar1,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::operator<<(local_18,")");
  return;
}

Assistant:

void SamplingStrategyResponse::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "SamplingStrategyResponse(";
  out << "strategyType=" << to_string(strategyType);
  out << ", " << "probabilisticSampling="; (__isset.probabilisticSampling ? (out << to_string(probabilisticSampling)) : (out << "<null>"));
  out << ", " << "rateLimitingSampling="; (__isset.rateLimitingSampling ? (out << to_string(rateLimitingSampling)) : (out << "<null>"));
  out << ", " << "operationSampling="; (__isset.operationSampling ? (out << to_string(operationSampling)) : (out << "<null>"));
  out << ")";
}